

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O1

int __thiscall IndexTree::balance(IndexTree *this,int32_t *root)

{
  short sVar1;
  int iVar2;
  Node *pNVar3;
  short sVar4;
  ushort uVar5;
  Node *_old_root;
  int iVar6;
  bool bVar7;
  
  pNVar3 = this->nodes;
  iVar6 = *root;
  if (pNVar3[iVar6].balance_factor < -1) {
    iVar2 = pNVar3[iVar6].left;
    sVar1 = pNVar3[iVar2].balance_factor;
    if (sVar1 != 1) {
      *root = iVar2;
      pNVar3[iVar6].left = pNVar3[iVar2].right;
      pNVar3[iVar2].right = iVar6;
      uVar5 = (ushort)*(undefined4 *)&pNVar3[iVar2].balance_factor;
      pNVar3[iVar2].balance_factor = uVar5 + 1;
      bVar7 = sVar1 != 0;
      pNVar3[iVar6].balance_factor = ~uVar5;
      goto LAB_00105c23;
    }
    iVar6 = -1;
  }
  else {
    if (pNVar3[iVar6].balance_factor < 2) {
      bVar7 = false;
      goto LAB_00105c23;
    }
    iVar2 = pNVar3[iVar6].right;
    sVar1 = pNVar3[iVar2].balance_factor;
    if (sVar1 != -1) {
      *root = iVar2;
      pNVar3[iVar6].right = pNVar3[iVar2].left;
      pNVar3[iVar2].left = iVar6;
      sVar4 = (short)*(undefined4 *)&pNVar3[iVar2].balance_factor;
      pNVar3[iVar2].balance_factor = sVar4 + -1;
      bVar7 = sVar1 != 0;
      pNVar3[iVar6].balance_factor = 1 - sVar4;
      goto LAB_00105c23;
    }
    iVar6 = 1;
  }
  rotateTwice(this,root,iVar6);
  bVar7 = true;
LAB_00105c23:
  return (int)bVar7;
}

Assistant:

int IndexTree::balance(int32_t &root) {
    int height_change = 0;
    auto &_root = nodes[root];
    if (_root.balance_factor < -1) {
        // left unbalanced, need right rotation
        if (nodes[_root.left].balance_factor == 1) {
            // LR rotation
            height_change = rotateTwice(root, -1);
        } else {
            // R rotation
            height_change = rotateOnce(root, 1);
        }
    } else if (_root.balance_factor > 1) {
        // right unbalanced, need left rotation
        if (nodes[_root.right].balance_factor == -1) {
            // RL rotation
            height_change = rotateTwice(root, 1);
        } else {
            // L rotation
            height_change = rotateOnce(root, -1);
        }
    }

    return height_change;
}